

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::OpenCompactionOutputFile(DBImpl *this,CompactionState *compact)

{
  bool bVar1;
  TableBuilder *this_00;
  uint64_t in_RDX;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar2;
  leveldb local_b8 [8];
  string fname;
  undefined1 local_88 [8];
  Output out;
  uint64_t local_28;
  uint64_t file_number;
  CompactionState *compact_local;
  DBImpl *this_local;
  Status *s;
  
  compact_local = compact;
  this_local = this;
  if (in_RDX == 0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x312,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x30) == 0) {
    file_number = in_RDX;
    port::Mutex::Lock((Mutex *)&compact[3].smallest_snapshot);
    local_28 = VersionSet::NewFileNumber((VersionSet *)compact[8].outfile);
    pVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &compact[7].outfile,&local_28);
    out.largest._24_8_ = pVar2.first._M_node;
    CompactionState::Output::Output((Output *)local_88);
    local_88 = (undefined1  [8])local_28;
    InternalKey::Clear((InternalKey *)&out.file_size);
    InternalKey::Clear((InternalKey *)&out.smallest.field_0x18);
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::push_back((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 *)(file_number + 0x10),(value_type *)local_88);
    port::Mutex::Unlock((Mutex *)&compact[3].smallest_snapshot);
    CompactionState::Output::~Output((Output *)local_88);
    TableFileName(local_b8,(string *)
                           &compact[2].outputs.
                            super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_28);
    (**(code **)(*(long *)compact->smallest_snapshot + 0x20))
              (this,(long *)compact->smallest_snapshot,local_b8,file_number + 0x28);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      this_00 = (TableBuilder *)operator_new(8);
      TableBuilder::TableBuilder
                (this_00,(Options *)&compact->builder,*(WritableFile **)(file_number + 0x28));
      *(TableBuilder **)(file_number + 0x30) = this_00;
    }
    std::__cxx11::string::~string((string *)local_b8);
    return (Status)(char *)this;
  }
  __assert_fail("compact->builder == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                ,0x313,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
}

Assistant:

Status DBImpl::OpenCompactionOutputFile(CompactionState* compact) {
  assert(compact != nullptr);
  assert(compact->builder == nullptr);
  uint64_t file_number;
  {
    mutex_.Lock();
    file_number = versions_->NewFileNumber();
    pending_outputs_.insert(file_number);
    CompactionState::Output out;
    out.number = file_number;
    out.smallest.Clear();
    out.largest.Clear();
    compact->outputs.push_back(out);
    mutex_.Unlock();
  }

  // Make the output file
  std::string fname = TableFileName(dbname_, file_number);
  Status s = env_->NewWritableFile(fname, &compact->outfile);
  if (s.ok()) {
    compact->builder = new TableBuilder(options_, compact->outfile);
  }
  return s;
}